

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O1

string * fs_expanduser_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  size_type *psVar1;
  undefined8 uVar2;
  _Bool _Var3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string home;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  char *local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar5 = path._M_str;
  uVar6 = path._M_len;
  if (uVar6 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((*pcVar5 != '~') ||
     (((uVar6 != 1 && (pcVar5[1] != '/')) &&
      ((_Var3 = fs_is_windows(), !_Var3 || (pcVar5[1] != '\\')))))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + uVar6);
    return __return_storage_ptr__;
  }
  fs_get_homedir_abi_cxx11_();
  if (local_88 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0010876f;
  }
  if (uVar6 < 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_90 == &local_80) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_78;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_90;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    }
    __return_storage_ptr__->_M_string_length = local_88;
    local_88 = 0;
    local_80 = '\0';
    local_90 = &local_80;
    goto LAB_0010876f;
  }
  uVar7 = 2;
  do {
    if ((pcVar5[uVar7] != '/') && ((_Var3 = fs_is_windows(), !_Var3 || (pcVar5[uVar7] != '\\'))))
    break;
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_90,local_90 + local_88);
  std::__cxx11::string::append((char *)&local_b0);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,pcVar5 + uVar6);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
  uVar6 = 0xf;
  if (local_b0 != local_a0) {
    uVar6 = local_a0[0];
  }
  if (uVar6 < (ulong)(local_68 + local_a8)) {
    uVar6 = 0xf;
    if (local_70 != local_60) {
      uVar6 = local_60[0];
    }
    if (uVar6 < (ulong)(local_68 + local_a8)) goto LAB_0010865d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0010865d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      '/') {
    std::__cxx11::string::pop_back();
  }
LAB_0010876f:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_expanduser(std::string_view path)
{
  if(path.empty()) FFS_UNLIKELY
    return {};

  if(path.front() != '~')
    return std::string(path);

  // second character is not a file separator
  // std::set is much slower than a simple if
  if(path.length() > 1 && !(path[1] == '/' || (fs_is_windows() && path[1] == '\\')))
    return std::string(path);

  std::string home = fs_get_homedir();
  if(home.empty()) FFS_UNLIKELY
    return {};

  if (path.length() < 3)
    return home;

// handle initial duplicated file separators. NOT .lexical_normal to handle "~/.."
// std::set is much slower than a simple if
  std::string::size_type i = 2;
  while(i < path.length() && (path[i] == '/' || (fs_is_windows() && path[i] == '\\')))
    i++;

  std::string e = home + "/" + std::string(path).substr(i);

  if (e.back() == '/')
    e.pop_back();

  return e;
}